

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O1

err_t ReadDataFloat(ebml_float *Element,stream *Input,ebml_parser_context *ParserContext,
                   bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  code *pcVar1;
  ulong uVar2;
  filepos_t fVar3;
  long lVar4;
  ulong uVar5;
  uint8_t Value [8];
  uint local_20;
  uint uStack_1c;
  
  lVar4 = (Element->Base).DataSize;
  if ((lVar4 != 4) && (lVar4 != 8)) {
    __assert_fail("Element->Base.DataSize == 8 || Element->Base.DataSize == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                  ,0xd2,
                  "err_t ReadDataFloat(ebml_float *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                 );
  }
  (Element->Base).bValueIsSet = '\0';
  if (Scope != 2) {
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xd9,
                    "err_t ReadDataFloat(ebml_float *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar1 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar3 = EBML_ElementPositionData(&Element->Base);
    lVar4 = (*pcVar1)(Input,fVar3,0);
    if (lVar4 == -1) {
      return -0x15;
    }
    uVar2 = (Element->Base).DataSize;
    if ((uVar2 != 8) && (uVar2 != 4)) {
      return -3;
    }
    uVar5 = 8;
    if (uVar2 < 8) {
      uVar5 = uVar2;
    }
    lVar4 = (**(code **)((long)(Input->Base).VMT + 0x58))(Input,&local_20,uVar5,0);
    if (lVar4 != 0) {
      return lVar4;
    }
    lVar4 = (Element->Base).DataSize;
    if (lVar4 == 8) {
      Element->Value =
           (double)((ulong)(uStack_1c >> 0x18) | (((ulong)uStack_1c & 0xff0000) << 0x20) >> 0x28 |
                    (((ulong)uStack_1c & 0xff00) << 0x20) >> 0x18 |
                    (((ulong)uStack_1c & 0xff) << 0x20) >> 8 | ((ulong)local_20 & 0xff000000) << 8 |
                    ((ulong)local_20 & 0xff0000) << 0x18 | ((ulong)local_20 & 0xff00) << 0x28 |
                   CONCAT44(uStack_1c,local_20) << 0x38);
    }
    else {
      if (lVar4 != 4) {
        return -4;
      }
      Element->Value =
           (double)(float)(local_20 >> 0x18 | (local_20 & 0xff0000) >> 8 | (local_20 & 0xff00) << 8
                          | local_20 << 0x18);
    }
    (Element->Base).bValueIsSet = '\x01';
  }
  return 0;
}

Assistant:

static err_t ReadDataFloat(ebml_float *Element, struct stream *Input, const ebml_parser_context *UNUSED_PARAM(ParserContext), bool_t UNUSED_PARAM(AllowDummyElt), int Scope, size_t UNUSED_PARAM(DepthCheckCRC))
{
    uint8_t Value[8];
    err_t Result;

    assert(Element->Base.DataSize == 8 || Element->Base.DataSize == 4);

    Element->Base.bValueIsSet = 0;

    if (Scope == SCOPE_NO_DATA)
        return ERR_NONE;

    if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
    {
        Result = ERR_READ;
        goto failed;
    }
    if (Element->Base.DataSize != 8 && Element->Base.DataSize != 4)
    {
        Result = ERR_INVALID_DATA;
        goto failed;
    }

    Result = Stream_Read(Input,Value,MIN((size_t)Element->Base.DataSize,sizeof(Value)),NULL); // min is for code safety
    if (Result != ERR_NONE)
        goto failed;

    if (Element->Base.DataSize == 4) {
        union {
            float f;
            uint32_t i;
        } data;
        data.i = LOAD32BE(Value);
        Element->Value = data.f;
        Element->Base.bValueIsSet = 1;
    } else if (Element->Base.DataSize == 8) {
        union {
            double f;
            uint64_t i;
        } data;
        data.i = LOAD64BE(Value);
        Element->Value = data.f;
        Element->Base.bValueIsSet = 1;
    } else
        Result = ERR_INVALID_PARAM;
failed:
    return Result;
}